

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O1

CompressedTexFormat glu::mapGLCompressedTexFormat(deUint32 format)

{
  CompressedTexFormat CVar1;
  InternalError *this;
  string local_40;
  
  switch(format) {
  case 0x93b0:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA;
    break;
  case 0x93b1:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA;
    break;
  case 0x93b2:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA;
    break;
  case 0x93b3:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA;
    break;
  case 0x93b4:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA;
    break;
  case 0x93b5:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA;
    break;
  case 0x93b6:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA;
    break;
  case 0x93b7:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA;
    break;
  case 0x93b8:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA;
    break;
  case 0x93b9:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA;
    break;
  case 0x93ba:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA;
    break;
  case 0x93bb:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA;
    break;
  case 0x93bc:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA;
    break;
  case 0x93bd:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA;
    break;
  case 0x93be:
  case 0x93bf:
  case 0x93c0:
  case 0x93c1:
  case 0x93c2:
  case 0x93c3:
  case 0x93c4:
  case 0x93c5:
  case 0x93c6:
  case 0x93c7:
  case 0x93c8:
  case 0x93c9:
  case 0x93ca:
  case 0x93cb:
  case 0x93cc:
  case 0x93cd:
  case 0x93ce:
  case 0x93cf:
switchD_00a3bcc9_caseD_93be:
    this = (InternalError *)__cxa_allocate_exception(0x38);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Can\'t map compressed GL format to compressed format","");
    tcu::InternalError::InternalError(this,&local_40);
    __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
  case 0x93d0:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8;
    break;
  case 0x93d1:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8;
    break;
  case 0x93d2:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8;
    break;
  case 0x93d3:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8;
    break;
  case 0x93d4:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8;
    break;
  case 0x93d5:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8;
    break;
  case 0x93d6:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8;
    break;
  case 0x93d7:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8;
    break;
  case 0x93d8:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8;
    break;
  case 0x93d9:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8;
    break;
  case 0x93da:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8;
    break;
  case 0x93db:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8;
    break;
  case 0x93dc:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8;
    break;
  case 0x93dd:
    CVar1 = COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8;
    break;
  default:
    switch(format) {
    case 0x9270:
      CVar1 = COMPRESSEDTEXFORMAT_EAC_R11;
      break;
    case 0x9271:
      CVar1 = COMPRESSEDTEXFORMAT_EAC_SIGNED_R11;
      break;
    case 0x9272:
      CVar1 = COMPRESSEDTEXFORMAT_EAC_RG11;
      break;
    case 0x9273:
      CVar1 = COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11;
      break;
    case 0x9274:
      CVar1 = COMPRESSEDTEXFORMAT_ETC2_RGB8;
      break;
    case 0x9275:
      CVar1 = COMPRESSEDTEXFORMAT_ETC2_SRGB8;
      break;
    case 0x9276:
      CVar1 = COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1;
      break;
    case 0x9277:
      CVar1 = COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1;
      break;
    case 0x9278:
      CVar1 = COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8;
      break;
    case 0x9279:
      CVar1 = COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8;
      break;
    default:
      CVar1 = COMPRESSEDTEXFORMAT_ETC1_RGB8;
      if (format != 0x8d64) goto switchD_00a3bcc9_caseD_93be;
    }
  }
  return CVar1;
}

Assistant:

tcu::CompressedTexFormat mapGLCompressedTexFormat (deUint32 format)
{
	switch (format)
	{
		case GL_ETC1_RGB8_OES:								return tcu::COMPRESSEDTEXFORMAT_ETC1_RGB8;
		case GL_COMPRESSED_R11_EAC:							return tcu::COMPRESSEDTEXFORMAT_EAC_R11;
		case GL_COMPRESSED_SIGNED_R11_EAC:					return tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_R11;
		case GL_COMPRESSED_RG11_EAC:						return tcu::COMPRESSEDTEXFORMAT_EAC_RG11;
		case GL_COMPRESSED_SIGNED_RG11_EAC:					return tcu::COMPRESSEDTEXFORMAT_EAC_SIGNED_RG11;
		case GL_COMPRESSED_RGB8_ETC2:						return tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8;
		case GL_COMPRESSED_SRGB8_ETC2:						return tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8;
		case GL_COMPRESSED_RGB8_PUNCHTHROUGH_ALPHA1_ETC2:	return tcu::COMPRESSEDTEXFORMAT_ETC2_RGB8_PUNCHTHROUGH_ALPHA1;
		case GL_COMPRESSED_SRGB8_PUNCHTHROUGH_ALPHA1_ETC2:	return tcu::COMPRESSEDTEXFORMAT_ETC2_SRGB8_PUNCHTHROUGH_ALPHA1;
		case GL_COMPRESSED_RGBA8_ETC2_EAC:					return tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_RGBA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ETC2_EAC:			return tcu::COMPRESSEDTEXFORMAT_ETC2_EAC_SRGB8_ALPHA8;

		case GL_COMPRESSED_RGBA_ASTC_4x4_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_5x4_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_5x5_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_6x5_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_6x6_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_8x5_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_8x6_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_8x8_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_10x5_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_10x6_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_10x8_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_10x10_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_12x10_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_RGBA;
		case GL_COMPRESSED_RGBA_ASTC_12x12_KHR:				return tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_RGBA;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_4x4_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_4x4_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x4_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_5x4_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_5x5_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_5x5_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x5_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_6x5_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_6x6_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_6x6_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x5_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_8x5_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x6_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_8x6_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_8x8_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_8x8_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x5_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x5_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x6_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x6_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x8_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x8_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_10x10_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_10x10_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x10_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_12x10_SRGB8_ALPHA8;
		case GL_COMPRESSED_SRGB8_ALPHA8_ASTC_12x12_KHR:		return tcu::COMPRESSEDTEXFORMAT_ASTC_12x12_SRGB8_ALPHA8;

		default:
			throw tcu::InternalError("Can't map compressed GL format to compressed format");
	}
}